

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int aRet;
  int extraout_EAX;
  
  aRet = sqlite3_bind_int64((this->mStmtPtr).mpStmt,__fd,(ulong)__addr & 0xffffffff);
  check(this,aRet);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const unsigned aValue)
{
    const int ret = sqlite3_bind_int64(mStmtPtr, aIndex, aValue);
    check(ret);
}